

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

int Abc_NtkPhaseFrameNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Aig_Man_t *p;
  Vec_Int_t *vInits;
  
  iVar1 = 1;
  p = Abc_NtkToDar(pNtk,0,1);
  if (p != (Aig_Man_t *)0x0) {
    vInits = Abc_NtkGetLatchValues(pNtk);
    iVar1 = Saig_ManPhaseFrameNum(p,vInits);
    if (vInits->pArray != (int *)0x0) {
      free(vInits->pArray);
      vInits->pArray = (int *)0x0;
    }
    if (vInits != (Vec_Int_t *)0x0) {
      free(vInits);
    }
    Aig_ManStop(p);
  }
  return iVar1;
}

Assistant:

int Abc_NtkPhaseFrameNum( Abc_Ntk_t * pNtk )
{
    extern int Saig_ManPhaseFrameNum( Aig_Man_t * p, Vec_Int_t * vInits );
    Vec_Int_t * vInits;
    Aig_Man_t * pMan;
    int nFrames;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return 1;
    vInits = Abc_NtkGetLatchValues(pNtk);
    nFrames = Saig_ManPhaseFrameNum( pMan, vInits );
    Vec_IntFree( vInits );
    Aig_ManStop( pMan );
    return nFrames;
}